

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

char * file_makename(lemon *lemp,char *suffix)

{
  size_t sVar1;
  size_t sVar2;
  char *__dest;
  char *pcVar3;
  FILE *pFVar4;
  char *__modes;
  char *suffix_00;
  lemon *lemp_00;
  
  pcVar3 = lemp->outbasefilename;
  suffix_00 = suffix;
  sVar1 = strlen(pcVar3);
  sVar2 = strlen(suffix);
  lemp_00 = (lemon *)(long)((int)sVar2 + (int)sVar1 + 5);
  __dest = (char *)malloc((size_t)lemp_00);
  if (__dest != (char *)0x0) {
    strcpy(__dest,pcVar3);
    pcVar3 = strrchr(__dest,0x2e);
    if (pcVar3 != (char *)0x0) {
      *pcVar3 = '\0';
    }
    pcVar3 = strcat(__dest,suffix);
    return pcVar3;
  }
  file_makename_cold_1();
  if (lemp_00->outname != (char *)0x0) {
    free(lemp_00->outname);
  }
  pcVar3 = file_makename(lemp_00,suffix_00);
  lemp_00->outname = pcVar3;
  pFVar4 = fopen(pcVar3,__modes);
  if ((pFVar4 == (FILE *)0x0) && (*__modes == 'w')) {
    file_open_cold_1();
  }
  return (char *)pFVar4;
}

Assistant:

PRIVATE char *file_makename(struct lemon *lemp, const char *suffix)
{
  char *name;
  char *cp;

  name = (char*)malloc( lemonStrlen(lemp->outbasefilename) + lemonStrlen(suffix) + 5 );
  if( name==0 ){
    fprintf(stderr,"Can't allocate space for a filename.\n");
    exit(1);
  }
  strcpy(name,lemp->outbasefilename);
  cp = strrchr(name,'.');
  if( cp ) *cp = 0;
  strcat(name,suffix);
  return name;
}